

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O2

pair<unsigned_int,_const_char_*> parse_char(char *src)

{
  byte bVar1;
  pair<unsigned_int,_const_char_*> pVar2;
  pair<unsigned_int,_const_char_*> pVar3;
  pair<unsigned_int,_const_char_*> pVar4;
  int size;
  uint uVar5;
  runtime_error *prVar6;
  byte *pbVar7;
  pair<unsigned_int,_const_char_*> pVar8;
  undefined8 uStack_70;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = *src;
  if (bVar1 != 0x5c) {
    if (bVar1 == 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"unexpected end of input");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar5 = ~(-1 << (8U - (char)*(int *)(decode_utf8(char_const*)::lookup + (ulong)(bVar1 >> 4) * 4)
                    & 0x1f)) & (uint)bVar1;
    pbVar7 = (byte *)(src + *(int *)(decode_utf8(char_const*)::lookup + (ulong)(bVar1 >> 4) * 4));
    while( true ) {
      src = (char *)((byte *)src + 1);
      pVar2.second = src;
      pVar2._0_8_ = CONCAT44(0,uVar5);
      pVar8.second = src;
      pVar8._0_8_ = CONCAT44(0,uVar5);
      if (pbVar7 <= src) {
        return pVar8;
      }
      if (*src == 0) break;
      uVar5 = uVar5 << 6 | (byte)*src & 0x3f;
    }
    return pVar2;
  }
  bVar1 = src[1];
  pVar3._1_7_ = 0;
  pVar3.first._0_1_ = bVar1;
  switch(bVar1) {
  case 0x6e:
    uStack_70 = 10;
    break;
  case 0x72:
    uStack_70 = 0xd;
    break;
  case 0x74:
    uStack_70 = 9;
    break;
  case 0x75:
    size = 4;
    goto LAB_001d8ba6;
  case 0x78:
    size = 2;
LAB_001d8ba6:
    pVar8 = parse_hex(src + 2,size);
    return pVar8;
  default:
    if ((bVar1 - 0x5b < 3) || (bVar1 == 0x22)) {
      pVar3.second = src + 2;
      return pVar3;
    }
    if (bVar1 == 0x55) {
      size = 8;
      goto LAB_001d8ba6;
    }
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x76:
  case 0x77:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"unknown escape at ",&local_59);
    std::operator+(&local_38,&local_58,src);
    std::runtime_error::runtime_error(prVar6,(string *)&local_38);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar4.second = src + 2;
  pVar4._0_8_ = uStack_70;
  return pVar4;
}

Assistant:

static std::pair<uint32_t, const char *> parse_char(const char * src) {
    if (*src == '\\') {
        switch (src[1]) {
            case 'x': return parse_hex(src + 2, 2);
            case 'u': return parse_hex(src + 2, 4);
            case 'U': return parse_hex(src + 2, 8);
            case 't': return std::make_pair('\t', src + 2);
            case 'r': return std::make_pair('\r', src + 2);
            case 'n': return std::make_pair('\n', src + 2);
            case '\\':
            case '"':
            case '[':
            case ']':
                      return std::make_pair(src[1], src + 2);
            default:
                      throw std::runtime_error(std::string("unknown escape at ") + src);
        }
    } else if (*src) {
        return decode_utf8(src);
    }
    throw std::runtime_error("unexpected end of input");
}